

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

Signature __thiscall wasm::HeapType::getSignature(HeapType *this)

{
  ulong uVar1;
  
  uVar1 = this->id;
  if ((0x7c < uVar1) && (*(int *)(uVar1 + 0x30) == 1)) {
    if (0x7c < uVar1) {
      return *(Signature *)(uVar1 + 0x38);
    }
    __assert_fail("!ht.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0xe6,"HeapTypeInfo *wasm::(anonymous namespace)::getHeapTypeInfo(HeapType)");
  }
  __assert_fail("isSignature()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x395,"Signature wasm::HeapType::getSignature() const");
}

Assistant:

Signature HeapType::getSignature() const {
  assert(isSignature());
  return getHeapTypeInfo(*this)->signature;
}